

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O1

void __thiscall
QtPrivate::QMovableArrayOps<std::pair<QString,_int>_>::reallocate
          (QMovableArrayOps<std::pair<QString,_int>_> *this,qsizetype alloc,AllocationOption option)

{
  pair<QArrayData_*,_void_*> pVar1;
  
  pVar1 = QArrayData::reallocateUnaligned
                    (&((this->super_QGenericArrayOps<std::pair<QString,_int>_>).
                       super_QArrayDataPointer<std::pair<QString,_int>_>.d)->super_QArrayData,
                     (this->super_QGenericArrayOps<std::pair<QString,_int>_>).
                     super_QArrayDataPointer<std::pair<QString,_int>_>.ptr,0x20,alloc,option);
  if (pVar1.second != (void *)0x0) {
    (this->super_QGenericArrayOps<std::pair<QString,_int>_>).
    super_QArrayDataPointer<std::pair<QString,_int>_>.d = (Data *)pVar1.first;
    (this->super_QGenericArrayOps<std::pair<QString,_int>_>).
    super_QArrayDataPointer<std::pair<QString,_int>_>.ptr = (pair<QString,_int> *)pVar1.second;
    return;
  }
  qBadAlloc();
}

Assistant:

void reallocate(qsizetype alloc, QArrayData::AllocationOption option)
    {
        auto pair = Data::reallocateUnaligned(this->d, this->ptr, alloc, option);
        Q_CHECK_PTR(pair.second);
        Q_ASSERT(pair.first != nullptr);
        this->d = pair.first;
        this->ptr = pair.second;
    }